

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O3

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int _c;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int _h;
  long lVar12;
  int iVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  undefined4 unaff_R13D;
  undefined4 uVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  Mat local_b8;
  int local_6c;
  int local_68;
  int local_64;
  Option *local_60;
  Mat *local_58;
  Mat *local_50;
  int local_44;
  uint local_40;
  uint local_3c;
  void *local_38;
  
  uVar1 = bottom_blob->dims;
  iVar7 = bottom_blob->w;
  _h = bottom_blob->h;
  local_6c = bottom_blob->d;
  _c = bottom_blob->c;
  pvVar2 = (this->axes).data;
  if ((pvVar2 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    auVar23._0_4_ = -(uint)(this->squeeze_w == 0);
    auVar23._4_4_ = -(uint)(this->squeeze_h == 0);
    auVar23._8_4_ = -(uint)(this->squeeze_d == 0);
    auVar23._12_4_ = -(uint)(this->squeeze_c == 0);
    uVar18 = movmskps(unaff_R13D,auVar23);
    bVar14 = (byte)uVar18 ^ 0xf;
    uVar16 = (uint)((bVar14 & 8) >> 3 & _c == 1);
    bVar20 = (bool)((bVar14 & 4) >> 2 & local_6c == 1);
    bVar9 = (bool)(iVar7 == 1 & bVar14);
    bVar17 = (bool)((bVar14 & 2) >> 1 & _h == 1);
  }
  else {
    lVar8 = (long)(this->axes).w;
    if (lVar8 < 1) {
      bVar9 = false;
      bVar17 = false;
      bVar20 = false;
      uVar16 = 0;
    }
    else {
      bVar21 = iVar7 == 1;
      bVar22 = _h == 1;
      local_3c = (uint)(_c == 1);
      local_40 = uVar1 - 3;
      lVar12 = 0;
      bVar17 = false;
      bVar9 = false;
      uVar15 = 0;
      bVar19 = false;
      do {
        iVar13 = *(int *)((long)pvVar2 + lVar12 * 4);
        iVar13 = (iVar13 >> 0x1f & uVar1) + iVar13;
        bVar10 = bVar9;
        bVar11 = bVar17;
        uVar16 = uVar15;
        if (iVar13 == 0) {
          bVar10 = bVar21;
          bVar11 = bVar22;
          uVar16 = local_3c;
        }
        if (uVar1 != 2) {
          bVar11 = bVar17;
        }
        if (uVar1 != 1) {
          bVar10 = bVar9;
        }
        bVar9 = bVar10;
        bVar20 = bVar19;
        bVar6 = bVar11;
        if (iVar13 == 1) {
          bVar9 = bVar21;
          bVar20 = local_6c == 1;
          bVar6 = bVar22;
        }
        if (uVar1 != 2) {
          bVar9 = bVar10;
        }
        if (uVar1 != 3) {
          bVar6 = bVar11;
        }
        bVar11 = bVar9;
        bVar17 = bVar6;
        if (iVar13 == 2) {
          bVar11 = bVar21;
          bVar17 = bVar22;
        }
        if (uVar1 != 3) {
          bVar11 = bVar9;
        }
        if (1 < local_40) {
          uVar16 = uVar15;
        }
        bVar9 = bVar11;
        if (iVar13 == 3) {
          bVar9 = bVar21;
        }
        if (uVar1 != 4) {
          bVar9 = bVar11;
          bVar20 = bVar19;
          bVar17 = bVar6;
        }
        lVar12 = lVar12 + 1;
        local_68 = iVar7;
        local_64 = _h;
        local_60 = opt;
        local_58 = bottom_blob;
        local_50 = top_blob;
        local_44 = _c;
        local_38 = pvVar2;
        uVar15 = uVar16;
        bVar19 = bVar20;
      } while (lVar8 != lVar12);
    }
  }
  if (top_blob != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            local_68 = iVar7;
            local_64 = _h;
            local_60 = opt;
            local_58 = bottom_blob;
            local_50 = top_blob;
            free(top_blob->data);
            opt = local_60;
            bottom_blob = local_58;
            top_blob = local_50;
            iVar7 = local_68;
            _h = local_64;
          }
        }
        else {
          local_68 = iVar7;
          local_64 = _h;
          local_60 = opt;
          local_58 = bottom_blob;
          local_50 = top_blob;
          (*top_blob->allocator->_vptr_Allocator[3])();
          opt = local_60;
          bottom_blob = local_58;
          top_blob = local_50;
          iVar7 = local_68;
          _h = local_64;
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar13 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    iVar5 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar13;
    top_blob->h = iVar4;
    top_blob->d = iVar5;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  switch(uVar1) {
  case 1:
    if (bVar9 == false) goto switchD_00403c79_default;
    Mat::reshape(&local_b8,bottom_blob,1,opt->blob_allocator);
    if (&local_b8 != top_blob) {
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->data = local_b8.data;
      top_blob->refcount = local_b8.refcount;
      top_blob->elemsize = local_b8.elemsize;
      top_blob->elempack = local_b8.elempack;
      top_blob->allocator = local_b8.allocator;
      top_blob->dims = local_b8.dims;
      top_blob->w = local_b8.w;
      top_blob->h = local_b8.h;
      top_blob->d = local_b8.d;
      top_blob->c = local_b8.c;
      top_blob->cstep = local_b8.cstep;
    }
    if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
    LOCK();
    *local_b8.refcount = *local_b8.refcount + -1;
    UNLOCK();
    if (*local_b8.refcount != 0) goto switchD_00403c79_default;
    if (local_b8.allocator != (Allocator *)0x0) {
      (*(local_b8.allocator)->_vptr_Allocator[3])();
      goto switchD_00403c79_default;
    }
    break;
  case 2:
    if (bVar9 == false) {
      if (bVar17 == false) goto switchD_00403c79_default;
      Mat::reshape(&local_b8,bottom_blob,iVar7,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto switchD_00403c79_default;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto switchD_00403c79_default;
      }
    }
    else if (bVar17 == false) {
      Mat::reshape(&local_b8,bottom_blob,_h,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto switchD_00403c79_default;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto switchD_00403c79_default;
      }
    }
    else {
      Mat::reshape(&local_b8,bottom_blob,1,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto switchD_00403c79_default;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto switchD_00403c79_default;
      }
    }
    break;
  case 3:
    if (bVar9 == false) {
      if (bVar17 == false) {
        if (uVar16 == 0) goto switchD_00403c79_default;
        Mat::reshape(&local_b8,bottom_blob,iVar7,_h,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
      else if (uVar16 == 0) {
        Mat::reshape(&local_b8,bottom_blob,iVar7,_c,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
      else {
        Mat::reshape(&local_b8,bottom_blob,iVar7,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
    }
    else if (bVar17 == false) {
      if (uVar16 == 0) {
        Mat::reshape(&local_b8,bottom_blob,_h,_c,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
      else {
        Mat::reshape(&local_b8,bottom_blob,_h,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
    }
    else if (uVar16 == 0) {
      Mat::reshape(&local_b8,bottom_blob,_c,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto switchD_00403c79_default;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto switchD_00403c79_default;
      }
    }
    else {
      Mat::reshape(&local_b8,bottom_blob,1,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto switchD_00403c79_default;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto switchD_00403c79_default;
      }
    }
    break;
  case 4:
    if (bVar9 == false) {
      if (bVar17 == false) {
        if (bVar20 == false) {
          if (uVar16 == 0) goto switchD_00403c79_default;
          Mat::reshape(&local_b8,bottom_blob,iVar7,_h,local_6c,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_00403c79_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
            goto switchD_00403c79_default;
          }
        }
        else if (uVar16 == 0) {
          Mat::reshape(&local_b8,bottom_blob,iVar7,_h,_c,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_00403c79_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
            goto switchD_00403c79_default;
          }
        }
        else {
          Mat::reshape(&local_b8,bottom_blob,iVar7,_h,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_00403c79_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
            goto switchD_00403c79_default;
          }
        }
      }
      else if (bVar20 == false) {
        if (uVar16 == 0) {
          Mat::reshape(&local_b8,bottom_blob,iVar7,local_6c,_c,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_00403c79_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
            goto switchD_00403c79_default;
          }
        }
        else {
          Mat::reshape(&local_b8,bottom_blob,iVar7,local_6c,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_00403c79_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
            goto switchD_00403c79_default;
          }
        }
      }
      else if (uVar16 == 0) {
        Mat::reshape(&local_b8,bottom_blob,iVar7,_c,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
      else {
        Mat::reshape(&local_b8,bottom_blob,iVar7,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
    }
    else if (bVar17 == false) {
      if (bVar20 == false) {
        if (uVar16 == 0) {
          Mat::reshape(&local_b8,bottom_blob,_h,local_6c,_c,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_00403c79_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
            goto switchD_00403c79_default;
          }
        }
        else {
          Mat::reshape(&local_b8,bottom_blob,_h,local_6c,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_00403c79_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
            goto switchD_00403c79_default;
          }
        }
      }
      else if (uVar16 == 0) {
        Mat::reshape(&local_b8,bottom_blob,_h,_c,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
      else {
        Mat::reshape(&local_b8,bottom_blob,_h,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
    }
    else if (bVar20 == false) {
      if (uVar16 == 0) {
        Mat::reshape(&local_b8,bottom_blob,local_6c,_c,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
      else {
        Mat::reshape(&local_b8,bottom_blob,local_6c,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_00403c79_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
          goto switchD_00403c79_default;
        }
      }
    }
    else if (uVar16 == 0) {
      Mat::reshape(&local_b8,bottom_blob,_c,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto switchD_00403c79_default;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto switchD_00403c79_default;
      }
    }
    else {
      Mat::reshape(&local_b8,bottom_blob,1,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto switchD_00403c79_default;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto switchD_00403c79_default;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto switchD_00403c79_default;
      }
    }
    break;
  default:
    goto switchD_00403c79_default;
  }
  if (local_b8.data != (void *)0x0) {
    free(local_b8.data);
  }
switchD_00403c79_default:
  if ((top_blob->data == (void *)0x0) || (iVar7 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar7 = -100;
  }
  return iVar7;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_d = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_d = d == 1 && squeeze_d;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;

            if (dims == 1 && axis == 0)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 0)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 4 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 4 && axis == 1)
            {
                _squeeze_d = d == 1;
            }
            if (dims == 4 && axis == 2)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 4 && axis == 3)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (dims == 4)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(d, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(d, channels, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, d, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, d, opt.blob_allocator);
        }
        else if (_squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, d, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, d, channels, opt.blob_allocator);
        }
        else if (_squeeze_d)
        {
            top_blob = bottom_blob.reshape(w, h, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, d, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}